

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O2

bool __thiscall iDynTree::SensorsList::isConsistent(SensorsList *this,Model *model)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  ConstIterator it;
  ConstIterator local_30;
  
  ConstIterator::ConstIterator(&local_30,&this->pimpl->allSensors);
  bVar3 = true;
  while( true ) {
    bVar1 = ConstIterator::isValid(&local_30);
    if (!bVar1) break;
    iVar2 = (*(*local_30.internalIterator._M_current)->_vptr_Sensor[7])
                      (*local_30.internalIterator._M_current,model);
    bVar3 = (bool)(bVar3 & (byte)iVar2);
    ConstIterator::operator++(&local_30);
  }
  return bVar3;
}

Assistant:

bool SensorsList::isConsistent(const Model& model) const
{
    bool isConsistent = true;
    for (SensorsList::ConstIterator it = this->allSensorsIterator();
         it.isValid(); ++it)
    {
        bool isCurrentSensorConsistent = (*it)->isConsistent(model);
        isConsistent = isConsistent && isCurrentSensorConsistent;
    }
    return isConsistent;
}